

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarAbSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nFrames,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Man_t *pAStack_38;
  int RetValue;
  Aig_Man_t *pMan2;
  Aig_Man_t *pMan1;
  int fVerbose_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pAStack_38 = (Aig_Man_t *)0x0;
  p = Abc_NtkToDar(pNtk1,0,1);
  if (p == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    return -1;
  }
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(pMan1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0xbf4,"int Abc_NtkDarAbSec(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk2 != (Abc_Ntk_t *)0x0) {
    pAStack_38 = Abc_NtkToDar(pNtk2,0,1);
    if (pAStack_38 == (Aig_Man_t *)0x0) {
      Aig_ManStop(p);
      Abc_Print(1,"Converting miter into AIG has failed.\n");
      return -1;
    }
    iVar1 = Aig_ManRegNum(pAStack_38);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pMan2) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0xbff,"int Abc_NtkDarAbSec(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    iVar1 = Saig_ManPiNum(p);
    iVar2 = Saig_ManPiNum(pAStack_38);
    if (iVar1 != iVar2) {
      Aig_ManStop(p);
      Aig_ManStop(pAStack_38);
      Abc_Print(1,"The networks have different number of PIs.\n");
      return -1;
    }
    iVar1 = Saig_ManPoNum(p);
    iVar2 = Saig_ManPoNum(pAStack_38);
    if (iVar1 != iVar2) {
      Aig_ManStop(p);
      Aig_ManStop(pAStack_38);
      Abc_Print(1,"The networks have different number of POs.\n");
      return -1;
    }
    iVar1 = Aig_ManRegNum(p);
    iVar2 = Aig_ManRegNum(pAStack_38);
    if (iVar1 != iVar2) {
      Aig_ManStop(p);
      Aig_ManStop(pAStack_38);
      Abc_Print(1,"The networks have different number of flops.\n");
      return -1;
    }
  }
  iVar1 = Ssw_SecSpecialMiter(p,pAStack_38,nFrames,fVerbose);
  Aig_ManStop(p);
  if (pAStack_38 != (Aig_Man_t *)0x0) {
    Aig_ManStop(pAStack_38);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarAbSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nFrames, int fVerbose )
{
    Aig_Man_t * pMan1, * pMan2 = NULL;
    int RetValue;
    // derive AIG manager
    pMan1 = Abc_NtkToDar( pNtk1, 0, 1 );
    if ( pMan1 == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( Aig_ManRegNum(pMan1) > 0 );
    // derive AIG manager
    if ( pNtk2 )
    {
        pMan2 = Abc_NtkToDar( pNtk2, 0, 1 );
        if ( pMan2 == NULL )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Converting miter into AIG has failed.\n" );
            return -1;
        }
        assert( Aig_ManRegNum(pMan2) > 0 );
        if ( Saig_ManPiNum(pMan1) != Saig_ManPiNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of PIs.\n" );
            return -1;
        }
        if ( Saig_ManPoNum(pMan1) != Saig_ManPoNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of POs.\n" );
            return -1;
        }
        if ( Aig_ManRegNum(pMan1) != Aig_ManRegNum(pMan2) )
        {
            Aig_ManStop( pMan1 );
            Aig_ManStop( pMan2 );
            Abc_Print( 1, "The networks have different number of flops.\n" );
            return -1;
        }
    }
    // perform verification
    RetValue = Ssw_SecSpecialMiter( pMan1, pMan2, nFrames, fVerbose );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    return RetValue;
}